

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_intra_pred_filters_ssse3_intr.c
# Opt level: O1

void ihevc_intra_pred_luma_ref_substitution_ssse3
               (UWORD8 *pu1_top_left,UWORD8 *pu1_top,UWORD8 *pu1_left,WORD32 src_strd,WORD32 nt,
               WORD32 nbr_flags,UWORD8 *pu1_dst,WORD32 dst_strd)

{
  uint *puVar1;
  byte bVar2;
  UWORD8 UVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  uint uVar34;
  ulong uVar35;
  uint uVar36;
  int iVar37;
  ulong uVar38;
  size_t __n;
  uint uVar39;
  uint uVar40;
  int iVar41;
  long lVar42;
  uint uVar43;
  uint uVar44;
  uint uVar45;
  long lVar46;
  undefined1 auVar47 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar48 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar49 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar50 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar51 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar52 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar53 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar54 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar55 [16];
  long lVar56;
  undefined1 in_XMM11 [16];
  long lVar58;
  undefined1 auVar57 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 in_XMM14 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  uint local_44 [5];
  
  if (nbr_flags == 0) {
    if (nt < 0) {
      return;
    }
    uVar40 = 0;
    if (0 < nt << 2) {
      uVar40 = nt << 2;
    }
    memset(pu1_dst,0x80,(ulong)(uVar40 | 1));
    return;
  }
  uVar40 = nt * 2;
  lVar46 = (long)(int)uVar40;
  pu1_dst[lVar46] = *pu1_top_left;
  if (0 < nt) {
    uVar35 = 1;
    if (1 < (int)uVar40) {
      uVar35 = (ulong)uVar40;
    }
    lVar42 = 0;
    do {
      pu1_dst[lVar42 + lVar46 + -1] = *pu1_left;
      pu1_left = pu1_left + src_strd;
      lVar42 = lVar42 + -1;
    } while (-lVar42 != uVar35);
  }
  if (0 < nt) {
    uVar35 = 1;
    if (1 < (int)uVar40) {
      uVar35 = (ulong)uVar40;
    }
    uVar38 = 0;
    do {
      pu1_dst[uVar38 + (ulong)uVar40 + 1] = pu1_top[uVar38];
      uVar38 = uVar38 + 1;
    } while (uVar35 != uVar38);
  }
  if (8 < nt) goto LAB_0013484f;
  uVar45 = (uint)nbr_flags >> 0x10 & 1;
  uVar39 = (uint)nbr_flags >> 7 & 1;
  uVar44 = (uint)nbr_flags >> 8 & 1;
  uVar43 = (uint)nbr_flags >> 0xc & 1;
  if ((nbr_flags & 8U) == 0) {
    local_44[0] = uVar39;
    local_44[1] = uVar45;
    local_44[2] = uVar44;
    local_44[3] = uVar43;
    uVar38 = (ulong)(uint)-nt;
    uVar34 = 0;
    uVar35 = 0;
    do {
      uVar36 = (int)uVar38 + nt;
      uVar38 = (ulong)uVar36;
      uVar34 = uVar34 + nt;
      puVar1 = local_44 + uVar35;
      uVar35 = uVar35 + 1;
    } while (*puVar1 == 0);
    if (uVar35 < 3) {
      if (0 < (int)uVar34) {
        __n = (size_t)uVar34;
        bVar2 = pu1_dst[__n];
LAB_00134082:
        memset(pu1_dst,(uint)bVar2,__n);
      }
    }
    else if (-1 < (int)uVar36) {
      __n = (size_t)(uVar36 + 1);
      bVar2 = pu1_dst[uVar38 + 1];
      goto LAB_00134082;
    }
  }
  auVar33 = _DAT_00170240;
  if (0 < nt && (char)uVar39 == '\0') {
    uVar35 = (ulong)(uint)nt;
    lVar42 = uVar35 - 1;
    auVar57._8_4_ = (int)lVar42;
    auVar57._0_8_ = lVar42;
    auVar57._12_4_ = (int)((ulong)lVar42 >> 0x20);
    in_XMM1 = pmovsxbq(in_XMM1,0xf0e);
    in_XMM2 = pmovsxbq(in_XMM2,0xd0c);
    in_XMM3 = pmovsxbq(in_XMM3,0xb0a);
    in_XMM4 = pmovsxbq(in_XMM4,0x908);
    in_XMM5 = pmovsxbq(in_XMM5,0x706);
    in_XMM6 = pmovsxbq(in_XMM6,0x504);
    in_XMM7 = pmovsxbq(in_XMM7,0x302);
    in_XMM8 = pmovsxbq(in_XMM8,0x100);
    uVar38 = 0;
    in_XMM11 = pmovsxbq(in_XMM11,0x1010);
    do {
      auVar59 = auVar57 ^ auVar33;
      lVar42 = auVar59._0_8_;
      auVar60._0_8_ = -(ulong)(lVar42 < SUB168(in_XMM8 ^ auVar33,0));
      lVar56 = auVar59._8_8_;
      auVar60._8_8_ = -(ulong)(lVar56 < SUB168(in_XMM8 ^ auVar33,8));
      auVar76 = pshuflw(in_XMM14,auVar60,0xe8);
      auVar77._8_4_ = 0xffffffff;
      auVar77._0_8_ = 0xffffffffffffffff;
      auVar77._12_4_ = 0xffffffff;
      auVar77 = packssdw(auVar76 ^ auVar77,auVar76 ^ auVar77);
      UVar3 = pu1_dst[uVar35 - 1];
      if ((auVar77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pu1_dst[uVar38 + uVar35] = UVar3;
      }
      auVar60 = packssdw(auVar60,auVar60);
      auVar76._8_4_ = 0xffffffff;
      auVar76._0_8_ = 0xffffffffffffffff;
      auVar76._12_4_ = 0xffffffff;
      auVar60 = packssdw(auVar60 ^ auVar76,auVar60 ^ auVar76);
      auVar60 = packsswb(auVar60,auVar60);
      if ((auVar60 & (undefined1  [16])0x100) != (undefined1  [16])0x0) {
        pu1_dst[uVar38 + uVar35 + 1] = UVar3;
      }
      auVar61._0_8_ = -(ulong)(lVar42 < SUB168(in_XMM7 ^ auVar33,0));
      auVar61._8_8_ = -(ulong)(lVar56 < SUB168(in_XMM7 ^ auVar33,8));
      auVar77 = packssdw(auVar77,auVar61);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar77 = packssdw(auVar77 ^ auVar4,auVar77 ^ auVar4);
      auVar77 = packsswb(auVar77,auVar77);
      if ((auVar77 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        pu1_dst[uVar38 + uVar35 + 2] = UVar3;
      }
      auVar60 = pshufhw(auVar61,auVar61,0x84);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar60 = packssdw(auVar60 ^ auVar5,auVar60 ^ auVar5);
      auVar60 = packsswb(auVar60,auVar60);
      if ((auVar60 & (undefined1  [16])0x1000000) != (undefined1  [16])0x0) {
        pu1_dst[uVar38 + uVar35 + 3] = UVar3;
      }
      auVar62._0_8_ = -(ulong)(lVar42 < SUB168(in_XMM6 ^ auVar33,0));
      auVar62._8_8_ = -(ulong)(lVar56 < SUB168(in_XMM6 ^ auVar33,8));
      auVar77 = pshuflw(auVar77,auVar62,0xe8);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar77 = packssdw(auVar77 ^ auVar6,auVar77 ^ auVar6);
      auVar77 = packsswb(auVar77,auVar77);
      if ((auVar77 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        pu1_dst[uVar38 + uVar35 + 4] = UVar3;
      }
      auVar60 = packssdw(auVar62,auVar62);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar60 = packssdw(auVar60 ^ auVar7,auVar60 ^ auVar7);
      auVar60 = packsswb(auVar60,auVar60);
      if ((auVar60 & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0) {
        pu1_dst[uVar38 + uVar35 + 5] = UVar3;
      }
      auVar63._0_8_ = -(ulong)(lVar42 < SUB168(in_XMM5 ^ auVar33,0));
      auVar63._8_8_ = -(ulong)(lVar56 < SUB168(in_XMM5 ^ auVar33,8));
      auVar77 = packssdw(auVar77,auVar63);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar77 = packssdw(auVar77 ^ auVar8,auVar77 ^ auVar8);
      auVar77 = packsswb(auVar77,auVar77);
      if ((auVar77 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        pu1_dst[uVar38 + uVar35 + 6] = UVar3;
      }
      auVar60 = pshufhw(auVar63,auVar63,0x84);
      auVar9._8_4_ = 0xffffffff;
      auVar9._0_8_ = 0xffffffffffffffff;
      auVar9._12_4_ = 0xffffffff;
      auVar60 = packssdw(auVar60 ^ auVar9,auVar60 ^ auVar9);
      auVar60 = packsswb(auVar60,auVar60);
      if ((auVar60 & (undefined1  [16])0x100000000000000) != (undefined1  [16])0x0) {
        pu1_dst[uVar38 + uVar35 + 7] = UVar3;
      }
      auVar64._0_8_ = -(ulong)(lVar42 < SUB168(in_XMM4 ^ auVar33,0));
      auVar64._8_8_ = -(ulong)(lVar56 < SUB168(in_XMM4 ^ auVar33,8));
      auVar77 = pshuflw(auVar77,auVar64,0xe8);
      auVar10._8_4_ = 0xffffffff;
      auVar10._0_8_ = 0xffffffffffffffff;
      auVar10._12_4_ = 0xffffffff;
      auVar77 = packssdw(auVar77 ^ auVar10,auVar77 ^ auVar10);
      auVar77 = packsswb(auVar77,auVar77);
      if ((auVar77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pu1_dst[uVar38 + uVar35 + 8] = UVar3;
      }
      auVar60 = packssdw(auVar64,auVar64);
      auVar11._8_4_ = 0xffffffff;
      auVar11._0_8_ = 0xffffffffffffffff;
      auVar11._12_4_ = 0xffffffff;
      auVar60 = packssdw(auVar60 ^ auVar11,auVar60 ^ auVar11);
      auVar60 = packsswb(auVar60,auVar60);
      if ((auVar60 & (undefined1  [16])0x100) != (undefined1  [16])0x0) {
        pu1_dst[uVar38 + uVar35 + 9] = UVar3;
      }
      auVar65._0_8_ = -(ulong)(lVar42 < SUB168(in_XMM3 ^ auVar33,0));
      auVar65._8_8_ = -(ulong)(lVar56 < SUB168(in_XMM3 ^ auVar33,8));
      auVar77 = packssdw(auVar77,auVar65);
      auVar12._8_4_ = 0xffffffff;
      auVar12._0_8_ = 0xffffffffffffffff;
      auVar12._12_4_ = 0xffffffff;
      auVar77 = packssdw(auVar77 ^ auVar12,auVar77 ^ auVar12);
      auVar77 = packsswb(auVar77,auVar77);
      if ((auVar77 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        pu1_dst[uVar38 + uVar35 + 10] = UVar3;
      }
      auVar60 = pshufhw(auVar65,auVar65,0x84);
      auVar13._8_4_ = 0xffffffff;
      auVar13._0_8_ = 0xffffffffffffffff;
      auVar13._12_4_ = 0xffffffff;
      auVar60 = packssdw(auVar60 ^ auVar13,auVar60 ^ auVar13);
      auVar60 = packsswb(auVar60,auVar60);
      if ((auVar60 & (undefined1  [16])0x1000000) != (undefined1  [16])0x0) {
        pu1_dst[uVar38 + uVar35 + 0xb] = UVar3;
      }
      auVar66._0_8_ = -(ulong)(lVar42 < SUB168(in_XMM2 ^ auVar33,0));
      auVar66._8_8_ = -(ulong)(lVar56 < SUB168(in_XMM2 ^ auVar33,8));
      auVar77 = pshuflw(auVar77,auVar66,0xe8);
      auVar14._8_4_ = 0xffffffff;
      auVar14._0_8_ = 0xffffffffffffffff;
      auVar14._12_4_ = 0xffffffff;
      auVar77 = packssdw(auVar77 ^ auVar14,auVar77 ^ auVar14);
      in_XMM14 = packsswb(auVar77,auVar77);
      if ((in_XMM14 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        pu1_dst[uVar38 + uVar35 + 0xc] = UVar3;
      }
      auVar77 = packssdw(auVar66,auVar66);
      auVar15._8_4_ = 0xffffffff;
      auVar15._0_8_ = 0xffffffffffffffff;
      auVar15._12_4_ = 0xffffffff;
      auVar77 = packssdw(auVar77 ^ auVar15,auVar77 ^ auVar15);
      auVar77 = packsswb(auVar77,auVar77);
      if ((auVar77 & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0) {
        pu1_dst[uVar38 + uVar35 + 0xd] = UVar3;
      }
      auVar67._0_8_ = -(ulong)(lVar42 < SUB168(in_XMM1 ^ auVar33,0));
      auVar67._8_8_ = -(ulong)(lVar56 < SUB168(in_XMM1 ^ auVar33,8));
      auVar77 = packssdw(auVar59,auVar67);
      auVar59._8_4_ = 0xffffffff;
      auVar59._0_8_ = 0xffffffffffffffff;
      auVar59._12_4_ = 0xffffffff;
      auVar77 = packssdw(auVar77 ^ auVar59,auVar77 ^ auVar59);
      auVar77 = packsswb(auVar77,auVar77);
      if ((auVar77 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        pu1_dst[uVar38 + uVar35 + 0xe] = UVar3;
      }
      auVar77 = pshufhw(auVar77,auVar67,0x84);
      auVar16._8_4_ = 0xffffffff;
      auVar16._0_8_ = 0xffffffffffffffff;
      auVar16._12_4_ = 0xffffffff;
      auVar77 = packssdw(auVar77 ^ auVar16,auVar77 ^ auVar16);
      auVar77 = packsswb(auVar77,auVar77);
      if ((auVar77 & (undefined1  [16])0x100000000000000) != (undefined1  [16])0x0) {
        pu1_dst[uVar38 + uVar35 + 0xf] = UVar3;
      }
      uVar38 = uVar38 + 0x10;
      lVar42 = in_XMM8._8_8_;
      lVar56 = in_XMM11._0_8_;
      in_XMM8._0_8_ = in_XMM8._0_8_ + lVar56;
      lVar58 = in_XMM11._8_8_;
      in_XMM8._8_8_ = lVar42 + lVar58;
      lVar42 = in_XMM7._8_8_;
      in_XMM7._0_8_ = in_XMM7._0_8_ + lVar56;
      in_XMM7._8_8_ = lVar42 + lVar58;
      lVar42 = in_XMM6._8_8_;
      in_XMM6._0_8_ = in_XMM6._0_8_ + lVar56;
      in_XMM6._8_8_ = lVar42 + lVar58;
      lVar42 = in_XMM5._8_8_;
      in_XMM5._0_8_ = in_XMM5._0_8_ + lVar56;
      in_XMM5._8_8_ = lVar42 + lVar58;
      lVar42 = in_XMM4._8_8_;
      in_XMM4._0_8_ = in_XMM4._0_8_ + lVar56;
      in_XMM4._8_8_ = lVar42 + lVar58;
      lVar42 = in_XMM3._8_8_;
      in_XMM3._0_8_ = in_XMM3._0_8_ + lVar56;
      in_XMM3._8_8_ = lVar42 + lVar58;
      lVar42 = in_XMM2._8_8_;
      in_XMM2._0_8_ = in_XMM2._0_8_ + lVar56;
      in_XMM2._8_8_ = lVar42 + lVar58;
      lVar42 = in_XMM1._8_8_;
      in_XMM1._0_8_ = in_XMM1._0_8_ + lVar56;
      in_XMM1._8_8_ = lVar42 + lVar58;
    } while ((nt + 0xfU & 0xfffffff0) != uVar38);
  }
  if (uVar45 == 0) {
    pu1_dst[lVar46] = pu1_dst[lVar46 + -1];
  }
  if (0 < nt && (char)uVar44 == '\0') {
    uVar35 = 0;
    do {
      pu1_dst[uVar35 + (ulong)uVar40 + 1] = pu1_dst[lVar46];
      uVar35 = uVar35 + 1;
    } while ((uint)nt != uVar35);
  }
  auVar33 = _DAT_00170240;
  if (0 < nt && (char)uVar43 == '\0') {
    uVar35 = (ulong)(uint)(nt * 3);
    lVar46 = (ulong)(uint)nt - 1;
    auVar47._8_4_ = (int)lVar46;
    auVar47._0_8_ = lVar46;
    auVar47._12_4_ = (int)((ulong)lVar46 >> 0x20);
    auVar48 = pmovsxbq(in_XMM1,0xf0e);
    auVar49 = pmovsxbq(in_XMM2,0xd0c);
    auVar50 = pmovsxbq(in_XMM3,0xb0a);
    auVar51 = pmovsxbq(in_XMM4,0x908);
    auVar52 = pmovsxbq(in_XMM5,0x706);
    auVar53 = pmovsxbq(in_XMM6,0x504);
    auVar54 = pmovsxbq(in_XMM7,0x302);
    auVar55 = pmovsxbq(in_XMM8,0x100);
    uVar38 = 0;
    auVar57 = pmovsxbq(in_XMM11,0x1010);
    do {
      auVar77 = auVar47 ^ auVar33;
      lVar46 = auVar77._0_8_;
      auVar68._0_8_ = -(ulong)(lVar46 < SUB168(auVar55 ^ auVar33,0));
      lVar42 = auVar77._8_8_;
      auVar68._8_8_ = -(ulong)(lVar42 < SUB168(auVar55 ^ auVar33,8));
      auVar59 = pshuflw(in_XMM14,auVar68,0xe8);
      auVar17._8_4_ = 0xffffffff;
      auVar17._0_8_ = 0xffffffffffffffff;
      auVar17._12_4_ = 0xffffffff;
      auVar59 = packssdw(auVar59 ^ auVar17,auVar59 ^ auVar17);
      UVar3 = pu1_dst[uVar35];
      if ((auVar59 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pu1_dst[uVar38 + uVar35 + 1] = UVar3;
      }
      auVar60 = packssdw(auVar68,auVar68);
      auVar18._8_4_ = 0xffffffff;
      auVar18._0_8_ = 0xffffffffffffffff;
      auVar18._12_4_ = 0xffffffff;
      auVar60 = packssdw(auVar60 ^ auVar18,auVar60 ^ auVar18);
      auVar60 = packsswb(auVar60,auVar60);
      if ((auVar60 & (undefined1  [16])0x100) != (undefined1  [16])0x0) {
        pu1_dst[uVar38 + uVar35 + 2] = UVar3;
      }
      auVar69._0_8_ = -(ulong)(lVar46 < SUB168(auVar54 ^ auVar33,0));
      auVar69._8_8_ = -(ulong)(lVar42 < SUB168(auVar54 ^ auVar33,8));
      auVar59 = packssdw(auVar59,auVar69);
      auVar19._8_4_ = 0xffffffff;
      auVar19._0_8_ = 0xffffffffffffffff;
      auVar19._12_4_ = 0xffffffff;
      auVar59 = packssdw(auVar59 ^ auVar19,auVar59 ^ auVar19);
      auVar59 = packsswb(auVar59,auVar59);
      if ((auVar59 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        pu1_dst[uVar38 + uVar35 + 3] = UVar3;
      }
      auVar60 = pshufhw(auVar69,auVar69,0x84);
      auVar20._8_4_ = 0xffffffff;
      auVar20._0_8_ = 0xffffffffffffffff;
      auVar20._12_4_ = 0xffffffff;
      auVar60 = packssdw(auVar60 ^ auVar20,auVar60 ^ auVar20);
      auVar60 = packsswb(auVar60,auVar60);
      if ((auVar60 & (undefined1  [16])0x1000000) != (undefined1  [16])0x0) {
        pu1_dst[uVar38 + uVar35 + 4] = UVar3;
      }
      auVar70._0_8_ = -(ulong)(lVar46 < SUB168(auVar53 ^ auVar33,0));
      auVar70._8_8_ = -(ulong)(lVar42 < SUB168(auVar53 ^ auVar33,8));
      auVar59 = pshuflw(auVar59,auVar70,0xe8);
      auVar21._8_4_ = 0xffffffff;
      auVar21._0_8_ = 0xffffffffffffffff;
      auVar21._12_4_ = 0xffffffff;
      auVar59 = packssdw(auVar59 ^ auVar21,auVar59 ^ auVar21);
      auVar59 = packsswb(auVar59,auVar59);
      if ((auVar59 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        pu1_dst[uVar38 + uVar35 + 5] = UVar3;
      }
      auVar60 = packssdw(auVar70,auVar70);
      auVar22._8_4_ = 0xffffffff;
      auVar22._0_8_ = 0xffffffffffffffff;
      auVar22._12_4_ = 0xffffffff;
      auVar60 = packssdw(auVar60 ^ auVar22,auVar60 ^ auVar22);
      auVar60 = packsswb(auVar60,auVar60);
      if ((auVar60 & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0) {
        pu1_dst[uVar38 + uVar35 + 6] = UVar3;
      }
      auVar71._0_8_ = -(ulong)(lVar46 < SUB168(auVar52 ^ auVar33,0));
      auVar71._8_8_ = -(ulong)(lVar42 < SUB168(auVar52 ^ auVar33,8));
      auVar59 = packssdw(auVar59,auVar71);
      auVar23._8_4_ = 0xffffffff;
      auVar23._0_8_ = 0xffffffffffffffff;
      auVar23._12_4_ = 0xffffffff;
      auVar59 = packssdw(auVar59 ^ auVar23,auVar59 ^ auVar23);
      auVar59 = packsswb(auVar59,auVar59);
      if ((auVar59 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        pu1_dst[uVar38 + uVar35 + 7] = UVar3;
      }
      auVar60 = pshufhw(auVar71,auVar71,0x84);
      auVar24._8_4_ = 0xffffffff;
      auVar24._0_8_ = 0xffffffffffffffff;
      auVar24._12_4_ = 0xffffffff;
      auVar60 = packssdw(auVar60 ^ auVar24,auVar60 ^ auVar24);
      auVar60 = packsswb(auVar60,auVar60);
      if ((auVar60 & (undefined1  [16])0x100000000000000) != (undefined1  [16])0x0) {
        pu1_dst[uVar38 + uVar35 + 8] = UVar3;
      }
      auVar72._0_8_ = -(ulong)(lVar46 < SUB168(auVar51 ^ auVar33,0));
      auVar72._8_8_ = -(ulong)(lVar42 < SUB168(auVar51 ^ auVar33,8));
      auVar59 = pshuflw(auVar59,auVar72,0xe8);
      auVar25._8_4_ = 0xffffffff;
      auVar25._0_8_ = 0xffffffffffffffff;
      auVar25._12_4_ = 0xffffffff;
      auVar59 = packssdw(auVar59 ^ auVar25,auVar59 ^ auVar25);
      auVar59 = packsswb(auVar59,auVar59);
      if ((auVar59 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pu1_dst[uVar38 + uVar35 + 9] = UVar3;
      }
      auVar60 = packssdw(auVar72,auVar72);
      auVar26._8_4_ = 0xffffffff;
      auVar26._0_8_ = 0xffffffffffffffff;
      auVar26._12_4_ = 0xffffffff;
      auVar60 = packssdw(auVar60 ^ auVar26,auVar60 ^ auVar26);
      auVar60 = packsswb(auVar60,auVar60);
      if ((auVar60 & (undefined1  [16])0x100) != (undefined1  [16])0x0) {
        pu1_dst[uVar38 + uVar35 + 10] = UVar3;
      }
      auVar73._0_8_ = -(ulong)(lVar46 < SUB168(auVar50 ^ auVar33,0));
      auVar73._8_8_ = -(ulong)(lVar42 < SUB168(auVar50 ^ auVar33,8));
      auVar59 = packssdw(auVar59,auVar73);
      auVar27._8_4_ = 0xffffffff;
      auVar27._0_8_ = 0xffffffffffffffff;
      auVar27._12_4_ = 0xffffffff;
      auVar59 = packssdw(auVar59 ^ auVar27,auVar59 ^ auVar27);
      auVar59 = packsswb(auVar59,auVar59);
      if ((auVar59 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        pu1_dst[uVar38 + uVar35 + 0xb] = UVar3;
      }
      auVar60 = pshufhw(auVar73,auVar73,0x84);
      auVar28._8_4_ = 0xffffffff;
      auVar28._0_8_ = 0xffffffffffffffff;
      auVar28._12_4_ = 0xffffffff;
      auVar60 = packssdw(auVar60 ^ auVar28,auVar60 ^ auVar28);
      auVar60 = packsswb(auVar60,auVar60);
      if ((auVar60 & (undefined1  [16])0x1000000) != (undefined1  [16])0x0) {
        pu1_dst[uVar38 + uVar35 + 0xc] = UVar3;
      }
      auVar74._0_8_ = -(ulong)(lVar46 < SUB168(auVar49 ^ auVar33,0));
      auVar74._8_8_ = -(ulong)(lVar42 < SUB168(auVar49 ^ auVar33,8));
      auVar59 = pshuflw(auVar59,auVar74,0xe8);
      auVar29._8_4_ = 0xffffffff;
      auVar29._0_8_ = 0xffffffffffffffff;
      auVar29._12_4_ = 0xffffffff;
      auVar59 = packssdw(auVar59 ^ auVar29,auVar59 ^ auVar29);
      in_XMM14 = packsswb(auVar59,auVar59);
      if ((in_XMM14 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        pu1_dst[uVar38 + uVar35 + 0xd] = UVar3;
      }
      auVar59 = packssdw(auVar74,auVar74);
      auVar30._8_4_ = 0xffffffff;
      auVar30._0_8_ = 0xffffffffffffffff;
      auVar30._12_4_ = 0xffffffff;
      auVar59 = packssdw(auVar59 ^ auVar30,auVar59 ^ auVar30);
      auVar59 = packsswb(auVar59,auVar59);
      if ((auVar59 & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0) {
        pu1_dst[uVar38 + uVar35 + 0xe] = UVar3;
      }
      auVar75._0_8_ = -(ulong)(lVar46 < SUB168(auVar48 ^ auVar33,0));
      auVar75._8_8_ = -(ulong)(lVar42 < SUB168(auVar48 ^ auVar33,8));
      auVar77 = packssdw(auVar77,auVar75);
      auVar31._8_4_ = 0xffffffff;
      auVar31._0_8_ = 0xffffffffffffffff;
      auVar31._12_4_ = 0xffffffff;
      auVar77 = packssdw(auVar77 ^ auVar31,auVar77 ^ auVar31);
      auVar77 = packsswb(auVar77,auVar77);
      if ((auVar77 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        pu1_dst[uVar38 + uVar35 + 0xf] = UVar3;
      }
      auVar77 = pshufhw(auVar77,auVar75,0x84);
      auVar32._8_4_ = 0xffffffff;
      auVar32._0_8_ = 0xffffffffffffffff;
      auVar32._12_4_ = 0xffffffff;
      auVar77 = packssdw(auVar77 ^ auVar32,auVar77 ^ auVar32);
      auVar77 = packsswb(auVar77,auVar77);
      if ((auVar77 & (undefined1  [16])0x100000000000000) != (undefined1  [16])0x0) {
        pu1_dst[uVar38 + uVar35 + 0x10] = UVar3;
      }
      uVar38 = uVar38 + 0x10;
      lVar46 = auVar55._8_8_;
      lVar42 = auVar57._0_8_;
      auVar55._0_8_ = auVar55._0_8_ + lVar42;
      lVar56 = auVar57._8_8_;
      auVar55._8_8_ = lVar46 + lVar56;
      lVar46 = auVar54._8_8_;
      auVar54._0_8_ = auVar54._0_8_ + lVar42;
      auVar54._8_8_ = lVar46 + lVar56;
      lVar46 = auVar53._8_8_;
      auVar53._0_8_ = auVar53._0_8_ + lVar42;
      auVar53._8_8_ = lVar46 + lVar56;
      lVar46 = auVar52._8_8_;
      auVar52._0_8_ = auVar52._0_8_ + lVar42;
      auVar52._8_8_ = lVar46 + lVar56;
      lVar46 = auVar51._8_8_;
      auVar51._0_8_ = auVar51._0_8_ + lVar42;
      auVar51._8_8_ = lVar46 + lVar56;
      lVar46 = auVar50._8_8_;
      auVar50._0_8_ = auVar50._0_8_ + lVar42;
      auVar50._8_8_ = lVar46 + lVar56;
      lVar46 = auVar49._8_8_;
      auVar49._0_8_ = auVar49._0_8_ + lVar42;
      auVar49._8_8_ = lVar46 + lVar56;
      lVar46 = auVar48._8_8_;
      auVar48._0_8_ = auVar48._0_8_ + lVar42;
      auVar48._8_8_ = lVar46 + lVar56;
    } while ((nt + 0xfU & 0xfffffff0) != uVar38);
  }
LAB_0013484f:
  if (nt == 0x20) {
    uVar40 = nbr_flags & 0xff;
    iVar41 = 0;
    if (uVar40 != 0) {
      for (; (uVar40 >> iVar41 & 1) == 0; iVar41 = iVar41 + 1) {
      }
    }
    uVar39 = iVar41 << 3;
    if (uVar40 == 0) {
      uVar39 = 0x40;
    }
    uVar35 = (ulong)uVar39;
    if ((uVar39 == 0x40) && (uVar35 = 0x40, ((uint)nbr_flags >> 0x10 & 1) == 0)) {
      uVar40 = (uint)nbr_flags >> 8 & 0xff;
      if (uVar40 == 0) {
        uVar35 = 0x81;
      }
      else {
        iVar41 = 0;
        if (uVar40 != 0) {
          for (; (uVar40 >> iVar41 & 1) == 0; iVar41 = iVar41 + 1) {
          }
        }
        uVar35 = (ulong)(iVar41 * 8 + 0x41);
      }
    }
    uVar40 = (uint)uVar35;
    if (0 < (int)uVar40) {
      memset(pu1_dst,(uint)pu1_dst[uVar35],uVar35);
    }
    while ((int)uVar40 < 0x81) {
      iVar41 = (int)uVar35;
      if (iVar41 == 0x40) {
        iVar37 = 1;
        if (((uint)nbr_flags >> 0x10 & 1) == 0) {
          pu1_dst[0x40] = pu1_dst[0x3f];
        }
      }
      else {
        iVar37 = 8;
        if (((uint)nbr_flags >> ((uint)(uVar35 >> 3) & 0x1f) & 1) == 0) {
          *(ulong *)(pu1_dst + iVar41) = (ulong)pu1_dst[(long)iVar41 + -1] * 0x101010101010101;
        }
      }
      uVar40 = iVar41 + iVar37;
      uVar35 = (ulong)uVar40;
    }
  }
  else if (nt == 0x10) {
    uVar40 = (uint)nbr_flags >> 4 & 0xc | (uint)nbr_flags >> 2 & 3;
    uVar39 = (uint)nbr_flags >> 6 & 0xc0 | (uint)nbr_flags >> 4 & 0x30;
    iVar41 = 0;
    if (uVar40 != 0) {
      for (; (uVar40 >> iVar41 & 1) == 0; iVar41 = iVar41 + 1) {
      }
    }
    uVar43 = 0x40;
    if (uVar40 != 0) {
      uVar43 = iVar41 << 3;
    }
    if (uVar43 == 0x40) {
      uVar43 = 0x20;
    }
    uVar35 = (ulong)uVar43;
    if ((uVar43 == 0x20) && (uVar35 = 0x20, ((uint)nbr_flags >> 0x10 & 1) == 0)) {
      if (uVar39 == 0) {
        uVar35 = 0x61;
      }
      else {
        iVar41 = 0;
        if (uVar39 >> 4 != 0) {
          for (; ((uVar39 >> 4) >> iVar41 & 1) == 0; iVar41 = iVar41 + 1) {
          }
        }
        uVar35 = (ulong)(iVar41 * 8 + 0x21);
      }
    }
    if (0 < (int)uVar35) {
      memset(pu1_dst,(uint)pu1_dst[uVar35],uVar35);
    }
    if ((int)uVar35 < 0x41) {
      uVar43 = (uint)nbr_flags >> 8 & 0x100;
      do {
        iVar41 = (int)uVar35;
        if (iVar41 == 0x20) {
          iVar37 = 1;
          if (uVar43 == 0) {
            pu1_dst[0x20] = pu1_dst[0x1f];
          }
        }
        else {
          iVar37 = 8;
          if (((uVar39 | uVar43 | uVar40) >> ((uint)(uVar35 >> 3) & 0x1f) & 1) == 0) {
            *(ulong *)(pu1_dst + iVar41) = (ulong)pu1_dst[(long)iVar41 + -1] * 0x101010101010101;
          }
        }
        uVar35 = (ulong)(uint)(iVar41 + iVar37);
      } while (iVar41 + iVar37 < 0x41);
    }
  }
  return;
}

Assistant:

void ihevc_intra_pred_luma_ref_substitution_ssse3(UWORD8 *pu1_top_left,
                                                  UWORD8 *pu1_top,
                                                  UWORD8 *pu1_left,
                                                  WORD32 src_strd,
                                                  WORD32 nt,
                                                  WORD32 nbr_flags,
                                                  UWORD8 *pu1_dst,
                                                  WORD32 dst_strd)
{
    UWORD8 pu1_ref;
    WORD32 dc_val, i;
    WORD32 total_samples = (4 * nt) + 1;
    WORD32 two_nt = 2 * nt;

    WORD32 three_nt = 3 * nt;
    WORD32 get_bits;
    WORD32 next;
    WORD32 bot_left, left, top, tp_right, tp_left;

    WORD32 idx, nbr_id_from_bl, frwd_nbr_flag;
    UNUSED(dst_strd);

    dc_val = 1 << (BIT_DEPTH - 1);


    /* Neighbor Flag Structure*/
    /* MSB ---> LSB */
    /*    Top-Left | Top-Right | Top | Left | Bottom-Left
              1         4         4     4         4
     */
    /* If no neighbor flags are present, fill the neighbor samples with DC value */
    if(nbr_flags == 0)
    {
        for(i = 0; i < total_samples; i++)
        {
            pu1_dst[i] = dc_val;
        }
    }
    else
    {
        /* Else fill the corresponding samples */
        pu1_dst[two_nt] = *pu1_top_left;
        for(i = 0; i < two_nt; i++)
            pu1_dst[two_nt - 1 - i] = pu1_left[i * src_strd];
        for(i = 0; i < two_nt; i++)
            pu1_dst[two_nt + 1 + i] = pu1_top[i];

        if(nt <= 8)
        {
            /* 1 bit extraction for all the neighboring blocks */
            tp_left = (nbr_flags & 0x10000) >> 16;
            bot_left = (nbr_flags & 0x8) >> 3;
            left = (nbr_flags & 0x80) >> 7;
            top = (nbr_flags & 0x100) >> 8;
            tp_right = (nbr_flags & 0x1000) >> 12;

            next = 1;

            /* If bottom -left is not available, reverse substitution process*/
            if(bot_left == 0)
            {
                WORD32 a_nbr_flag[5] = { bot_left, left, tp_left, top, tp_right };

                /* Check for the 1st available sample from bottom-left*/
                while(!a_nbr_flag[next])
                    next++;

                /* If Left, top-left are available*/
                if(next <= 2)
                {
                    idx = nt * next;
                    pu1_ref = pu1_dst[idx];
                    for(i = 0; i < idx; i++)
                        pu1_dst[i] = pu1_ref;
                }
                else /* If top, top-right are available */
                {
                    /* Idx is changed to copy 1 pixel value for top-left ,if top-left is not available*/
                    idx = (nt * (next - 1)) + 1;
                    pu1_ref = pu1_dst[idx];
                    for(i = 0; i < idx; i++)
                        pu1_dst[i] = pu1_ref;
                }
            }

            /* Forward Substitution Process */
            /* If left is Unavailable, copy the last bottom-left value */
            if(left == 0)
            {
                for(i = 0; i < nt; i++)
                    pu1_dst[nt + i] = pu1_dst[nt - 1];
            }
            /* If top-left is Unavailable, copy the last left value */
            if(tp_left == 0)
                pu1_dst[two_nt] = pu1_dst[two_nt - 1];
            /* If top is Unavailable, copy the last top-left value */
            if(top == 0)
            {
                for(i = 0; i < nt; i++)
                    pu1_dst[two_nt + 1 + i] = pu1_dst[two_nt];
            }
            /* If to right is Unavailable, copy the last top value */
            if(tp_right == 0)
            {
                for(i = 0; i < nt; i++)
                    pu1_dst[three_nt + 1 + i] = pu1_dst[three_nt];
            }
        }

        if(nt == 16)
        {
            WORD32 nbr_flags_temp = 0;
            nbr_flags_temp = ((nbr_flags & 0xC) >> 2) + ((nbr_flags & 0xC0) >> 4)
                            + ((nbr_flags & 0x300) >> 4)
                            + ((nbr_flags & 0x3000) >> 6)
                            + ((nbr_flags & 0x10000) >> 8);

            /* compute trailing zeors based on nbr_flag for substitution process of below left see section .*/
            /* as each bit in nbr flags corresponds to 8 pels for bot_left, left, top and topright but 1 pel for topleft */
            {
                nbr_id_from_bl = look_up_trailing_zeros(nbr_flags_temp & 0XF) * 8; /* for below left and left */

                if(nbr_id_from_bl == 64)
                    nbr_id_from_bl = 32;

                if(nbr_id_from_bl == 32)
                {
                    /* for top left : 1 pel per nbr bit */
                    if(!((nbr_flags_temp >> 8) & 0x1))
                    {
                        nbr_id_from_bl++;
                        nbr_id_from_bl += look_up_trailing_zeros((nbr_flags_temp >> 4) & 0xF) * 8; /* top and top right;  8 pels per nbr bit */
                        //nbr_id_from_bl += idx * 8;
                    }
                }
                /* Reverse Substitution Process*/
                if(nbr_id_from_bl)
                {
                    /* Replicate the bottom-left and subsequent unavailable pixels with the 1st available pixel above */
                    pu1_ref = pu1_dst[nbr_id_from_bl];
                    for(i = (nbr_id_from_bl - 1); i >= 0; i--)
                    {
                        pu1_dst[i] = pu1_ref;
                    }
                }
            }

            /* for the loop of 4*Nt+1 pixels (excluding pixels computed from reverse substitution) */
            while(nbr_id_from_bl < ((T16_4NT) + 1))
            {
                /* To Obtain the next unavailable idx flag after reverse neighbor substitution  */
                /* Devide by 8 to obtain the original index */
                frwd_nbr_flag = (nbr_id_from_bl >> 3); /*+ (nbr_id_from_bl & 0x1);*/

                /* The Top-left flag is at the last bit location of nbr_flags*/
                if(nbr_id_from_bl == (T16_4NT / 2))
                {
                    get_bits = GET_BITS(nbr_flags_temp, 8);

                    /* only pel substitution for TL */
                    if(!get_bits)
                        pu1_dst[nbr_id_from_bl] = pu1_dst[nbr_id_from_bl - 1];
                }
                else
                {
                    get_bits = GET_BITS(nbr_flags_temp, frwd_nbr_flag);
                    if(!get_bits)
                    {
                        /* 8 pel substitution (other than TL) */
                        pu1_ref = pu1_dst[nbr_id_from_bl - 1];
                        for(i = 0; i < 8; i++)
                            pu1_dst[nbr_id_from_bl + i] = pu1_ref;
                    }

                }
                nbr_id_from_bl += (nbr_id_from_bl == (T16_4NT / 2)) ? 1 : 8;
            }


        }

        if(nt == 32)
        {
            /* compute trailing ones based on mbr_flag for substitution process of below left see section .*/
            /* as each bit in nbr flags corresponds to 8 pels for bot_left, left, top and topright but 1 pel for topleft */
            {
                nbr_id_from_bl = look_up_trailing_zeros((nbr_flags & 0XFF)) * 8; /* for below left and left */

                if(nbr_id_from_bl == 64)
                {
                    /* for top left : 1 pel per nbr bit */
                    if(!((nbr_flags >> 16) & 0x1))
                    {
                        /* top left not available */
                        nbr_id_from_bl++;
                        /* top and top right;  8 pels per nbr bit */
                        nbr_id_from_bl += look_up_trailing_zeros((nbr_flags >> 8) & 0xFF) * 8;
                    }
                }
                /* Reverse Substitution Process*/
                if(nbr_id_from_bl)
                {
                    /* Replicate the bottom-left and subsequent unavailable pixels with the 1st available pixel above */
                    pu1_ref = pu1_dst[nbr_id_from_bl];
                    for(i = (nbr_id_from_bl - 1); i >= 0; i--)
                        pu1_dst[i] = pu1_ref;
                }
            }

            /* for the loop of 4*Nt+1 pixels (excluding pixels computed from reverse substitution) */
            while(nbr_id_from_bl < ((T32_4NT) + 1))
            {
                /* To Obtain the next unavailable idx flag after reverse neighbor substitution  */
                /* Devide by 8 to obtain the original index */
                frwd_nbr_flag = (nbr_id_from_bl >> 3); /*+ (nbr_id_from_bl & 0x1);*/

                /* The Top-left flag is at the last bit location of nbr_flags*/
                if(nbr_id_from_bl == (T32_4NT / 2))
                {
                    get_bits = GET_BITS(nbr_flags, 16);
                    /* only pel substitution for TL */
                    if(!get_bits)
                        pu1_dst[nbr_id_from_bl] = pu1_dst[nbr_id_from_bl - 1];
                }
                else
                {
                    get_bits = GET_BITS(nbr_flags, frwd_nbr_flag);
                    if(!get_bits)
                    {
                        /* 8 pel substitution (other than TL) */
                        pu1_ref = pu1_dst[nbr_id_from_bl - 1];
                        for(i = 0; i < 8; i++)
                            pu1_dst[nbr_id_from_bl + i] = pu1_ref;
                    }

                }
                nbr_id_from_bl += (nbr_id_from_bl == (T32_4NT / 2)) ? 1 : 8;
            }
        }

    }
}